

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int32_t floatx80_to_int32_m68k(floatx80 a,float_status *status)

{
  flag fVar1;
  ushort uVar2;
  int32_t iVar3;
  int iVar4;
  flag zSign;
  int count;
  uint64_t aSig;
  
  aSig = a.low;
  uVar2 = a.high & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)aSig)
  {
    status->float_exception_flags = status->float_exception_flags | 1;
    return -0x80000000;
  }
  fVar1 = (flag)((a._8_8_ & 0xffff) >> 0xf);
  zSign = '\0';
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
    zSign = fVar1;
  }
  if (uVar2 != 0x7fff) {
    zSign = fVar1;
  }
  iVar4 = 0x4037 - (uint)uVar2;
  count = 1;
  if (1 < iVar4) {
    count = iVar4;
  }
  shift64RightJamming(aSig,count,&aSig);
  iVar3 = roundAndPackInt32(zSign,aSig,status);
  return iVar3;
}

Assistant:

int32_t floatx80_to_int32(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp, shiftCount;
    uint64_t aSig;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return 1 << 31;
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( ( aExp == 0x7FFF ) && (uint64_t) ( aSig<<1 ) ) aSign = 0;
    shiftCount = 0x4037 - aExp;
    if ( shiftCount <= 0 ) shiftCount = 1;
    shift64RightJamming( aSig, shiftCount, &aSig );
    return roundAndPackInt32(aSign, aSig, status);

}